

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O2

void __thiscall
KDReports::ReportBuilder::copyStateFrom(ReportBuilder *this,ReportBuilder *parentBuilder)

{
  qreal qVar1;
  
  QArrayDataPointer<QTextOption::Tab>::operator=
            (&(this->m_tabPositions).d,&(parentBuilder->m_tabPositions).d);
  qVar1 = parentBuilder->m_rightMargin;
  this->m_leftMargin = parentBuilder->m_leftMargin;
  this->m_rightMargin = qVar1;
  qVar1 = parentBuilder->m_bottomMargin;
  this->m_topMargin = parentBuilder->m_topMargin;
  this->m_bottomMargin = qVar1;
  QFont::operator=(&this->m_defaultFont,&parentBuilder->m_defaultFont);
  return;
}

Assistant:

void KDReports::ReportBuilder::copyStateFrom(const ReportBuilder &parentBuilder)
{
    m_tabPositions = parentBuilder.m_tabPositions;
    m_leftMargin = parentBuilder.m_leftMargin;
    m_rightMargin = parentBuilder.m_rightMargin;
    m_topMargin = parentBuilder.m_topMargin;
    m_bottomMargin = parentBuilder.m_bottomMargin;
    m_defaultFont = parentBuilder.m_defaultFont;
}